

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_internal_export_key
          (psa_key_slot_t *slot,uint8_t *data,size_t data_size,size_t *data_length,
          int export_public_key)

{
  ushort uVar1;
  size_t sVar2;
  int ret;
  uint ret_00;
  psa_status_t pVar3;
  size_t sVar4;
  ulong uVar5;
  uint8_t *__src;
  uchar *c;
  mbedtls_pk_context local_48;
  uint8_t *local_38;
  
  *data_length = 0;
  if ((export_public_key != 0) && (((slot->attr).type & 0x4000) == 0)) {
    return -0x87;
  }
  if (data_size == 0) {
    return -0x8a;
  }
  uVar1 = (slot->attr).type;
  if (((uVar1 & 0x7000) == 0x2000) || ((uVar1 & 0x7000) == 0x1000)) {
    sVar4 = (slot->data).raw.bytes;
    if (data_size < sVar4) {
      return -0x8a;
    }
    memcpy(data,(slot->data).raw.data,sVar4);
    sVar2 = (slot->data).raw.bytes;
    memset(data + sVar2,0,data_size - sVar2);
    *data_length = (slot->data).raw.bytes;
    return 0;
  }
  if ((uVar1 & 0xff00) == 0x7100 && export_public_key == 0) {
    uVar5 = (ulong)((slot->attr).bits + 7 >> 3);
    if (data_size < uVar5) {
      return -0x8a;
    }
    ret = mbedtls_mpi_write_binary((mbedtls_mpi *)&(((slot->data).rsa)->RP).p,data,uVar5);
    pVar3 = mbedtls_to_psa_error(ret);
    if (pVar3 != 0) {
      return pVar3;
    }
    memset(data + uVar5,0,data_size - uVar5);
    *data_length = uVar5;
    return 0;
  }
  if ((uVar1 & 0xcfff) != 0x4001 && (uVar1 & 0xcf00) != 0x4100) {
    return -0x86;
  }
  mbedtls_pk_init(&local_48);
  if ((uVar1 & 0xcfff) == 0x4001) {
    local_48.pk_info = &mbedtls_rsa_info;
  }
  else {
    local_48.pk_info = &mbedtls_eckey_info;
  }
  local_48.pk_ctx = (slot->data).raw.data;
  if ((export_public_key == 0) && (((slot->attr).type & 0x7000) != 0x4000)) {
    ret_00 = mbedtls_pk_write_key_der(&local_48,data,data_size);
  }
  else {
    local_38 = data + data_size;
    ret_00 = mbedtls_pk_write_pubkey(&local_38,data,&local_48);
  }
  uVar5 = (ulong)ret_00;
  if ((int)ret_00 < 0) {
    memset(data,0,data_size);
    pVar3 = mbedtls_to_psa_error(ret_00);
    return pVar3;
  }
  if (data_size < uVar5 * 2) {
    if (data_size < uVar5 || data_size - uVar5 == 0) goto LAB_00127fe6;
    memmove(data,data + (data_size - uVar5),uVar5);
    __src = data + uVar5;
    sVar4 = data_size - uVar5;
  }
  else {
    __src = data + (data_size - uVar5);
    memcpy(data,__src,uVar5);
    sVar4 = uVar5;
  }
  memset(__src,0,sVar4);
LAB_00127fe6:
  *data_length = uVar5;
  return 0;
}

Assistant:

static psa_status_t psa_internal_export_key( const psa_key_slot_t *slot,
                                             uint8_t *data,
                                             size_t data_size,
                                             size_t *data_length,
                                             int export_public_key )
{
#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    const psa_drv_se_t *drv;
    psa_drv_se_context_t *drv_context;
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    *data_length = 0;

    if( export_public_key && ! PSA_KEY_TYPE_IS_ASYMMETRIC( slot->attr.type ) )
        return( PSA_ERROR_INVALID_ARGUMENT );

    /* Reject a zero-length output buffer now, since this can never be a
     * valid key representation. This way we know that data must be a valid
     * pointer and we can do things like memset(data, ..., data_size). */
    if( data_size == 0 )
        return( PSA_ERROR_BUFFER_TOO_SMALL );

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( psa_get_se_driver( slot->attr.lifetime, &drv, &drv_context ) )
    {
        psa_drv_se_export_key_t method;
        if( drv->key_management == NULL )
            return( PSA_ERROR_NOT_SUPPORTED );
        method = ( export_public_key ?
                   drv->key_management->p_export_public :
                   drv->key_management->p_export );
        if( method == NULL )
            return( PSA_ERROR_NOT_SUPPORTED );
        return( method( drv_context,
                        slot->data.se.slot_number,
                        data, data_size, data_length ) );
    }
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    if( key_type_is_raw_bytes( slot->attr.type ) )
    {
        if( slot->data.raw.bytes > data_size )
            return( PSA_ERROR_BUFFER_TOO_SMALL );
        memcpy( data, slot->data.raw.data, slot->data.raw.bytes );
        memset( data + slot->data.raw.bytes, 0,
                data_size - slot->data.raw.bytes );
        *data_length = slot->data.raw.bytes;
        return( PSA_SUCCESS );
    }
#if defined(MBEDTLS_ECP_C)
    if( PSA_KEY_TYPE_IS_ECC_KEY_PAIR( slot->attr.type ) && !export_public_key )
    {
        psa_status_t status;

        size_t bytes = PSA_BITS_TO_BYTES( slot->attr.bits );
        if( bytes > data_size )
            return( PSA_ERROR_BUFFER_TOO_SMALL );
        status = mbedtls_to_psa_error(
            mbedtls_mpi_write_binary( &slot->data.ecp->d, data, bytes ) );
        if( status != PSA_SUCCESS )
            return( status );
        memset( data + bytes, 0, data_size - bytes );
        *data_length = bytes;
        return( PSA_SUCCESS );
    }
#endif
    else
    {
#if defined(MBEDTLS_PK_WRITE_C)
        if( PSA_KEY_TYPE_IS_RSA( slot->attr.type ) ||
            PSA_KEY_TYPE_IS_ECC( slot->attr.type ) )
        {
            mbedtls_pk_context pk;
            int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
            if( PSA_KEY_TYPE_IS_RSA( slot->attr.type ) )
            {
#if defined(MBEDTLS_RSA_C)
                mbedtls_pk_init( &pk );
                pk.pk_info = &mbedtls_rsa_info;
                pk.pk_ctx = slot->data.rsa;
#else
                return( PSA_ERROR_NOT_SUPPORTED );
#endif
            }
            else
            {
#if defined(MBEDTLS_ECP_C)
                mbedtls_pk_init( &pk );
                pk.pk_info = &mbedtls_eckey_info;
                pk.pk_ctx = slot->data.ecp;
#else
                return( PSA_ERROR_NOT_SUPPORTED );
#endif
            }
            if( export_public_key || PSA_KEY_TYPE_IS_PUBLIC_KEY( slot->attr.type ) )
            {
                ret = pk_write_pubkey_simple( &pk, data, data_size );
            }
            else
            {
                ret = mbedtls_pk_write_key_der( &pk, data, data_size );
            }
            if( ret < 0 )
            {
                memset( data, 0, data_size );
                return( mbedtls_to_psa_error( ret ) );
            }
            /* The mbedtls_pk_xxx functions write to the end of the buffer.
             * Move the data to the beginning and erase remaining data
             * at the original location. */
            if( 2 * (size_t) ret <= data_size )
            {
                memcpy( data, data + data_size - ret, ret );
                memset( data + data_size - ret, 0, ret );
            }
            else if( (size_t) ret < data_size )
            {
                memmove( data, data + data_size - ret, ret );
                memset( data + ret, 0, data_size - ret );
            }
            *data_length = ret;
            return( PSA_SUCCESS );
        }
        else
#endif /* defined(MBEDTLS_PK_WRITE_C) */
        {
            /* This shouldn't happen in the reference implementation, but
               it is valid for a special-purpose implementation to omit
               support for exporting certain key types. */
            return( PSA_ERROR_NOT_SUPPORTED );
        }
    }
}